

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  RTCIntersectArguments *pRVar50;
  ulong uVar51;
  Geometry *pGVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  float fVar58;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  undefined8 uVar87;
  float fVar91;
  float fVar92;
  undefined1 auVar88 [16];
  float fVar93;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar107 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar152 [32];
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar154 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_17f1;
  Ray *local_17f0;
  RayQueryContext *local_17e8;
  uint local_17dc;
  uint local_17d8;
  int local_17d4;
  Scene *local_17d0;
  ulong local_17c8;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  ulong local_1780;
  ulong local_1778;
  ulong local_1770;
  long local_1768;
  long local_1760;
  ulong *local_1758;
  ulong local_1750;
  long local_1748;
  long local_1740;
  ulong local_1738;
  ulong local_1730;
  ulong local_1728;
  ulong local_1720;
  ulong local_1718;
  ulong local_1710;
  long local_1708;
  undefined8 local_1700;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  undefined4 local_16e0;
  float local_16dc;
  float local_16d8;
  undefined4 local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  uint local_16c4;
  uint local_16c0;
  RTCFilterFunctionNArguments local_16b0;
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [8];
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined1 local_1440 [32];
  undefined4 local_1420;
  undefined4 uStack_141c;
  undefined4 uStack_1418;
  undefined4 uStack_1414;
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 *local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar139 = ray->tfar;
    if (0.0 <= fVar139) {
      local_1758 = local_11f8;
      aVar1 = (ray->dir).field_0;
      auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar1,auVar94);
      auVar104._8_4_ = 0x219392ef;
      auVar104._0_8_ = 0x219392ef219392ef;
      auVar104._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar104,1);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar104 = vdivps_avx(auVar105,(undefined1  [16])aVar1);
      auVar106._8_4_ = 0x5d5e0b6b;
      auVar106._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar106._12_4_ = 0x5d5e0b6b;
      auVar94 = vblendvps_avx(auVar104,auVar106,auVar94);
      auVar95._0_4_ = auVar94._0_4_ * 0.99999964;
      auVar95._4_4_ = auVar94._4_4_ * 0.99999964;
      auVar95._8_4_ = auVar94._8_4_ * 0.99999964;
      auVar95._12_4_ = auVar94._12_4_ * 0.99999964;
      uVar68 = *(undefined4 *)&(ray->org).field_0;
      local_1480._4_4_ = uVar68;
      local_1480._0_4_ = uVar68;
      local_1480._8_4_ = uVar68;
      local_1480._12_4_ = uVar68;
      local_1480._16_4_ = uVar68;
      local_1480._20_4_ = uVar68;
      local_1480._24_4_ = uVar68;
      local_1480._28_4_ = uVar68;
      auVar126 = ZEXT3264(local_1480);
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_14a0._4_4_ = uVar68;
      local_14a0._0_4_ = uVar68;
      local_14a0._8_4_ = uVar68;
      local_14a0._12_4_ = uVar68;
      local_14a0._16_4_ = uVar68;
      local_14a0._20_4_ = uVar68;
      local_14a0._24_4_ = uVar68;
      local_14a0._28_4_ = uVar68;
      auVar135 = ZEXT3264(local_14a0);
      auVar88._0_4_ = auVar94._0_4_ * 1.0000004;
      auVar88._4_4_ = auVar94._4_4_ * 1.0000004;
      auVar88._8_4_ = auVar94._8_4_ * 1.0000004;
      auVar88._12_4_ = auVar94._12_4_ * 1.0000004;
      uVar68 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_14c0._4_4_ = uVar68;
      local_14c0._0_4_ = uVar68;
      local_14c0._8_4_ = uVar68;
      local_14c0._12_4_ = uVar68;
      local_14c0._16_4_ = uVar68;
      local_14c0._20_4_ = uVar68;
      local_14c0._24_4_ = uVar68;
      local_14c0._28_4_ = uVar68;
      auVar137 = ZEXT3264(local_14c0);
      auVar94 = vmovshdup_avx(auVar95);
      uVar87 = auVar94._0_8_;
      local_1500._8_8_ = uVar87;
      local_1500._0_8_ = uVar87;
      local_1500._16_8_ = uVar87;
      local_1500._24_8_ = uVar87;
      auVar146 = ZEXT3264(local_1500);
      auVar105 = vshufpd_avx(auVar95,auVar95,1);
      auVar104 = vshufps_avx(auVar95,auVar95,0xaa);
      uVar87 = auVar104._0_8_;
      local_1520._8_8_ = uVar87;
      local_1520._0_8_ = uVar87;
      local_1520._16_8_ = uVar87;
      local_1520._24_8_ = uVar87;
      auVar151 = ZEXT3264(local_1520);
      auVar104 = vmovshdup_avx(auVar88);
      uVar87 = auVar104._0_8_;
      local_1560._8_8_ = uVar87;
      local_1560._0_8_ = uVar87;
      local_1560._16_8_ = uVar87;
      local_1560._24_8_ = uVar87;
      auVar154 = ZEXT3264(local_1560);
      auVar104 = vshufps_avx(auVar88,auVar88,0xaa);
      uVar87 = auVar104._0_8_;
      local_15c0._8_8_ = uVar87;
      local_15c0._0_8_ = uVar87;
      local_15c0._16_8_ = uVar87;
      local_15c0._24_8_ = uVar87;
      auVar103 = ZEXT3264(local_15c0);
      uVar45 = (ulong)(auVar95._0_4_ < 0.0) << 5;
      uVar53 = (ulong)(auVar94._0_4_ < 0.0) << 5 | 0x40;
      uVar54 = (ulong)(auVar105._0_4_ < 0.0) << 5 | 0x80;
      uVar55 = uVar45 ^ 0x20;
      uVar56 = uVar53 ^ 0x20;
      uVar68 = auVar11._0_4_;
      local_15e0._4_4_ = uVar68;
      local_15e0._0_4_ = uVar68;
      local_15e0._8_4_ = uVar68;
      local_15e0._12_4_ = uVar68;
      local_15e0._16_4_ = uVar68;
      local_15e0._20_4_ = uVar68;
      local_15e0._24_4_ = uVar68;
      local_15e0._28_4_ = uVar68;
      auVar109 = ZEXT3264(local_15e0);
      local_1600._4_4_ = fVar139;
      local_1600._0_4_ = fVar139;
      local_1600._8_4_ = fVar139;
      local_1600._12_4_ = fVar139;
      local_1600._16_4_ = fVar139;
      local_1600._20_4_ = fVar139;
      local_1600._24_4_ = fVar139;
      local_1600._28_4_ = fVar139;
      auVar117 = ZEXT3264(local_1600);
      local_1710 = (ulong)(((uint)(auVar95._0_4_ < 0.0) << 5) >> 2);
      local_1718 = uVar55 >> 2;
      local_1720 = uVar53 >> 2;
      local_1728 = uVar56 >> 2;
      local_1730 = uVar54 >> 2;
      local_15a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_15a0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1440 = vperm2f128_avx(local_15a0,mm_lookupmask_ps._0_32_,2);
      local_1738 = (uVar54 ^ 0x20) >> 2;
      auVar80._8_4_ = 0x3f800000;
      auVar80._0_8_ = 0x3f8000003f800000;
      auVar80._12_4_ = 0x3f800000;
      auVar80._16_4_ = 0x3f800000;
      auVar80._20_4_ = 0x3f800000;
      auVar80._24_4_ = 0x3f800000;
      auVar80._28_4_ = 0x3f800000;
      auVar100._8_4_ = 0xbf800000;
      auVar100._0_8_ = 0xbf800000bf800000;
      auVar100._12_4_ = 0xbf800000;
      auVar100._16_4_ = 0xbf800000;
      auVar100._20_4_ = 0xbf800000;
      auVar100._24_4_ = 0xbf800000;
      auVar100._28_4_ = 0xbf800000;
      _local_1460 = vblendvps_avx(auVar80,auVar100,local_1440);
      local_1778 = uVar45;
      local_14e0 = auVar95._0_4_;
      fStack_14dc = auVar95._0_4_;
      fStack_14d8 = auVar95._0_4_;
      fStack_14d4 = auVar95._0_4_;
      fStack_14d0 = auVar95._0_4_;
      fStack_14cc = auVar95._0_4_;
      fStack_14c8 = auVar95._0_4_;
      fStack_14c4 = auVar95._0_4_;
      local_1540 = auVar88._0_4_;
      fStack_153c = auVar88._0_4_;
      fStack_1538 = auVar88._0_4_;
      fStack_1534 = auVar88._0_4_;
      fStack_1530 = auVar88._0_4_;
      fStack_152c = auVar88._0_4_;
      fStack_1528 = auVar88._0_4_;
      fStack_1524 = auVar88._0_4_;
      local_1780 = uVar53;
      fVar139 = auVar95._0_4_;
      fVar140 = auVar95._0_4_;
      fVar141 = auVar95._0_4_;
      fVar142 = auVar95._0_4_;
      fVar143 = auVar95._0_4_;
      fVar144 = auVar95._0_4_;
      fVar58 = auVar88._0_4_;
      fVar63 = auVar88._0_4_;
      fVar64 = auVar88._0_4_;
      fVar65 = auVar88._0_4_;
      fVar66 = auVar88._0_4_;
      fVar67 = auVar88._0_4_;
      local_17f0 = ray;
      local_17e8 = context;
      do {
        uVar51 = local_1758[-1];
        local_1758 = local_1758 + -1;
        while ((uVar51 & 8) == 0) {
          auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar45),auVar126._0_32_);
          auVar77._4_4_ = fVar139 * auVar100._4_4_;
          auVar77._0_4_ = auVar95._0_4_ * auVar100._0_4_;
          auVar77._8_4_ = fVar140 * auVar100._8_4_;
          auVar77._12_4_ = fVar141 * auVar100._12_4_;
          auVar77._16_4_ = fVar142 * auVar100._16_4_;
          auVar77._20_4_ = fVar143 * auVar100._20_4_;
          auVar77._24_4_ = fVar144 * auVar100._24_4_;
          auVar77._28_4_ = auVar100._28_4_;
          auVar100 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar53),auVar135._0_32_);
          auVar18._4_4_ = auVar146._4_4_ * auVar100._4_4_;
          auVar18._0_4_ = auVar146._0_4_ * auVar100._0_4_;
          auVar18._8_4_ = auVar146._8_4_ * auVar100._8_4_;
          auVar18._12_4_ = auVar146._12_4_ * auVar100._12_4_;
          auVar18._16_4_ = auVar146._16_4_ * auVar100._16_4_;
          auVar18._20_4_ = auVar146._20_4_ * auVar100._20_4_;
          auVar18._24_4_ = auVar146._24_4_ * auVar100._24_4_;
          auVar18._28_4_ = auVar100._28_4_;
          auVar100 = vmaxps_avx(auVar77,auVar18);
          auVar80 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar54),auVar137._0_32_);
          auVar15._4_4_ = auVar151._4_4_ * auVar80._4_4_;
          auVar15._0_4_ = auVar151._0_4_ * auVar80._0_4_;
          auVar15._8_4_ = auVar151._8_4_ * auVar80._8_4_;
          auVar15._12_4_ = auVar151._12_4_ * auVar80._12_4_;
          auVar15._16_4_ = auVar151._16_4_ * auVar80._16_4_;
          auVar15._20_4_ = auVar151._20_4_ * auVar80._20_4_;
          auVar15._24_4_ = auVar151._24_4_ * auVar80._24_4_;
          auVar15._28_4_ = auVar80._28_4_;
          auVar80 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar55),auVar126._0_32_);
          auVar116._4_4_ = fVar58 * auVar80._4_4_;
          auVar116._0_4_ = auVar88._0_4_ * auVar80._0_4_;
          auVar116._8_4_ = fVar63 * auVar80._8_4_;
          auVar116._12_4_ = fVar64 * auVar80._12_4_;
          auVar116._16_4_ = fVar65 * auVar80._16_4_;
          auVar116._20_4_ = fVar66 * auVar80._20_4_;
          auVar116._24_4_ = fVar67 * auVar80._24_4_;
          auVar116._28_4_ = auVar80._28_4_;
          auVar80 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + uVar56),auVar135._0_32_);
          auVar16._4_4_ = auVar154._4_4_ * auVar80._4_4_;
          auVar16._0_4_ = auVar154._0_4_ * auVar80._0_4_;
          auVar16._8_4_ = auVar154._8_4_ * auVar80._8_4_;
          auVar16._12_4_ = auVar154._12_4_ * auVar80._12_4_;
          auVar16._16_4_ = auVar154._16_4_ * auVar80._16_4_;
          auVar16._20_4_ = auVar154._20_4_ * auVar80._20_4_;
          auVar16._24_4_ = auVar154._24_4_ * auVar80._24_4_;
          auVar16._28_4_ = auVar80._28_4_;
          auVar77 = vminps_avx(auVar116,auVar16);
          auVar80 = vsubps_avx(*(undefined1 (*) [32])(uVar51 + 0x40 + (uVar54 ^ 0x20)),
                               auVar137._0_32_);
          auVar17._4_4_ = auVar103._4_4_ * auVar80._4_4_;
          auVar17._0_4_ = auVar103._0_4_ * auVar80._0_4_;
          auVar17._8_4_ = auVar103._8_4_ * auVar80._8_4_;
          auVar17._12_4_ = auVar103._12_4_ * auVar80._12_4_;
          auVar17._16_4_ = auVar103._16_4_ * auVar80._16_4_;
          auVar17._20_4_ = auVar103._20_4_ * auVar80._20_4_;
          auVar17._24_4_ = auVar103._24_4_ * auVar80._24_4_;
          auVar17._28_4_ = auVar80._28_4_;
          auVar80 = vmaxps_avx(auVar15,auVar109._0_32_);
          auVar100 = vmaxps_avx(auVar100,auVar80);
          auVar80 = vminps_avx(auVar17,auVar117._0_32_);
          auVar80 = vminps_avx(auVar77,auVar80);
          auVar100 = vcmpps_avx(auVar100,auVar80,2);
          uVar46 = vmovmskps_avx(auVar100);
          if (uVar46 == 0) goto LAB_004d9241;
          uVar46 = uVar46 & 0xff;
          uVar43 = uVar51 & 0xfffffffffffffff0;
          lVar44 = 0;
          for (uVar51 = (ulong)uVar46; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
          {
            lVar44 = lVar44 + 1;
          }
          uVar51 = *(ulong *)(uVar43 + lVar44 * 8);
          uVar46 = uVar46 - 1 & uVar46;
          uVar47 = (ulong)uVar46;
          if (uVar46 != 0) {
            *local_1758 = uVar51;
            lVar44 = 0;
            for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
              lVar44 = lVar44 + 1;
            }
            uVar46 = uVar46 - 1 & uVar46;
            uVar47 = (ulong)uVar46;
            bVar57 = uVar46 == 0;
            while( true ) {
              local_1758 = local_1758 + 1;
              uVar51 = *(ulong *)(uVar43 + lVar44 * 8);
              if (bVar57) break;
              *local_1758 = uVar51;
              lVar44 = 0;
              for (uVar51 = uVar47; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                lVar44 = lVar44 + 1;
              }
              uVar47 = uVar47 - 1 & uVar47;
              bVar57 = uVar47 == 0;
            }
          }
        }
        local_1760 = (ulong)((uint)uVar51 & 0xf) - 8;
        if (local_1760 != 0) {
          uVar51 = uVar51 & 0xfffffffffffffff0;
          local_1768 = 0;
          do {
            lVar44 = local_1768 * 0x90;
            local_1708 = uVar51 + lVar44;
            uVar68 = *(undefined4 *)(uVar51 + 0x70 + lVar44);
            auVar70._4_4_ = uVar68;
            auVar70._0_4_ = uVar68;
            auVar70._8_4_ = uVar68;
            auVar70._12_4_ = uVar68;
            auVar70._16_4_ = uVar68;
            auVar70._20_4_ = uVar68;
            auVar70._24_4_ = uVar68;
            auVar70._28_4_ = uVar68;
            uVar68 = *(undefined4 *)(uVar51 + 0x7c + lVar44);
            auVar81._4_4_ = uVar68;
            auVar81._0_4_ = uVar68;
            auVar81._8_4_ = uVar68;
            auVar81._12_4_ = uVar68;
            auVar81._16_4_ = uVar68;
            auVar81._20_4_ = uVar68;
            auVar81._24_4_ = uVar68;
            auVar81._28_4_ = uVar68;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(local_1710 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar11);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar11 = vfmadd213ps_fma(auVar100,auVar81,auVar70);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_1718 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar3);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar105 = vfmadd213ps_fma(auVar100,auVar81,auVar70);
            uVar68 = *(undefined4 *)(uVar51 + 0x74 + lVar44);
            auVar71._4_4_ = uVar68;
            auVar71._0_4_ = uVar68;
            auVar71._8_4_ = uVar68;
            auVar71._12_4_ = uVar68;
            auVar71._16_4_ = uVar68;
            auVar71._20_4_ = uVar68;
            auVar71._24_4_ = uVar68;
            auVar71._28_4_ = uVar68;
            uVar68 = *(undefined4 *)(uVar51 + 0x80 + lVar44);
            auVar82._4_4_ = uVar68;
            auVar82._0_4_ = uVar68;
            auVar82._8_4_ = uVar68;
            auVar82._12_4_ = uVar68;
            auVar82._16_4_ = uVar68;
            auVar82._20_4_ = uVar68;
            auVar82._24_4_ = uVar68;
            auVar82._28_4_ = uVar68;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(local_1720 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar4);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar106 = vfmadd213ps_fma(auVar100,auVar82,auVar71);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_1728 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar5);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar3 = vfmadd213ps_fma(auVar100,auVar82,auVar71);
            uVar68 = *(undefined4 *)(uVar51 + 0x78 + lVar44);
            auVar72._4_4_ = uVar68;
            auVar72._0_4_ = uVar68;
            auVar72._8_4_ = uVar68;
            auVar72._12_4_ = uVar68;
            auVar72._16_4_ = uVar68;
            auVar72._20_4_ = uVar68;
            auVar72._24_4_ = uVar68;
            auVar72._28_4_ = uVar68;
            uVar68 = *(undefined4 *)(uVar51 + 0x84 + lVar44);
            auVar83._4_4_ = uVar68;
            auVar83._0_4_ = uVar68;
            auVar83._8_4_ = uVar68;
            auVar83._12_4_ = uVar68;
            auVar83._16_4_ = uVar68;
            auVar83._20_4_ = uVar68;
            auVar83._24_4_ = uVar68;
            auVar83._28_4_ = uVar68;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(local_1730 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar6);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar4 = vfmadd213ps_fma(auVar100,auVar83,auVar72);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(local_1738 + 0x40 + local_1708);
            auVar100 = vpmovzxbd_avx2(auVar7);
            auVar100 = vcvtdq2ps_avx(auVar100);
            auVar5 = vfmadd213ps_fma(auVar100,auVar83,auVar72);
            auVar69._8_8_ = 0;
            auVar69._0_8_ = *(ulong *)(uVar51 + 0x40 + lVar44);
            auVar79._8_8_ = 0;
            auVar79._0_8_ = *(ulong *)(uVar51 + 0x48 + lVar44);
            auVar94 = vpminub_avx(auVar69,auVar79);
            auVar104 = vpcmpeqb_avx(auVar69,auVar94);
            auVar100 = vsubps_avx(ZEXT1632(auVar11),auVar126._0_32_);
            auVar101._4_4_ = fVar139 * auVar100._4_4_;
            auVar101._0_4_ = auVar95._0_4_ * auVar100._0_4_;
            auVar101._8_4_ = fVar140 * auVar100._8_4_;
            auVar101._12_4_ = fVar141 * auVar100._12_4_;
            auVar101._16_4_ = fVar142 * auVar100._16_4_;
            auVar101._20_4_ = fVar143 * auVar100._20_4_;
            auVar101._24_4_ = fVar144 * auVar100._24_4_;
            auVar101._28_4_ = auVar100._28_4_;
            auVar100 = vsubps_avx(ZEXT1632(auVar106),auVar135._0_32_);
            auVar20._4_4_ = auVar146._4_4_ * auVar100._4_4_;
            auVar20._0_4_ = auVar146._0_4_ * auVar100._0_4_;
            auVar20._8_4_ = auVar146._8_4_ * auVar100._8_4_;
            auVar20._12_4_ = auVar146._12_4_ * auVar100._12_4_;
            auVar20._16_4_ = auVar146._16_4_ * auVar100._16_4_;
            auVar20._20_4_ = auVar146._20_4_ * auVar100._20_4_;
            auVar20._24_4_ = auVar146._24_4_ * auVar100._24_4_;
            auVar20._28_4_ = auVar100._28_4_;
            auVar100 = vmaxps_avx(auVar101,auVar20);
            auVar80 = vsubps_avx(ZEXT1632(auVar105),auVar126._0_32_);
            auVar21._4_4_ = fVar58 * auVar80._4_4_;
            auVar21._0_4_ = auVar88._0_4_ * auVar80._0_4_;
            auVar21._8_4_ = fVar63 * auVar80._8_4_;
            auVar21._12_4_ = fVar64 * auVar80._12_4_;
            auVar21._16_4_ = fVar65 * auVar80._16_4_;
            auVar21._20_4_ = fVar66 * auVar80._20_4_;
            auVar21._24_4_ = fVar67 * auVar80._24_4_;
            auVar21._28_4_ = auVar80._28_4_;
            auVar80 = vsubps_avx(ZEXT1632(auVar3),auVar135._0_32_);
            auVar22._4_4_ = auVar154._4_4_ * auVar80._4_4_;
            auVar22._0_4_ = auVar154._0_4_ * auVar80._0_4_;
            auVar22._8_4_ = auVar154._8_4_ * auVar80._8_4_;
            auVar22._12_4_ = auVar154._12_4_ * auVar80._12_4_;
            auVar22._16_4_ = auVar154._16_4_ * auVar80._16_4_;
            auVar22._20_4_ = auVar154._20_4_ * auVar80._20_4_;
            auVar22._24_4_ = auVar154._24_4_ * auVar80._24_4_;
            auVar22._28_4_ = auVar80._28_4_;
            auVar77 = vminps_avx(auVar21,auVar22);
            auVar80 = vsubps_avx(ZEXT1632(auVar4),auVar137._0_32_);
            auVar23._4_4_ = auVar151._4_4_ * auVar80._4_4_;
            auVar23._0_4_ = auVar151._0_4_ * auVar80._0_4_;
            auVar23._8_4_ = auVar151._8_4_ * auVar80._8_4_;
            auVar23._12_4_ = auVar151._12_4_ * auVar80._12_4_;
            auVar23._16_4_ = auVar151._16_4_ * auVar80._16_4_;
            auVar23._20_4_ = auVar151._20_4_ * auVar80._20_4_;
            auVar23._24_4_ = auVar151._24_4_ * auVar80._24_4_;
            auVar23._28_4_ = auVar80._28_4_;
            auVar80 = vmaxps_avx(auVar23,local_15e0);
            auVar100 = vmaxps_avx(auVar100,auVar80);
            auVar80 = vsubps_avx(ZEXT1632(auVar5),auVar137._0_32_);
            auVar24._4_4_ = local_15c0._4_4_ * auVar80._4_4_;
            auVar24._0_4_ = local_15c0._0_4_ * auVar80._0_4_;
            auVar24._8_4_ = local_15c0._8_4_ * auVar80._8_4_;
            auVar24._12_4_ = local_15c0._12_4_ * auVar80._12_4_;
            auVar24._16_4_ = local_15c0._16_4_ * auVar80._16_4_;
            auVar24._20_4_ = local_15c0._20_4_ * auVar80._20_4_;
            auVar24._24_4_ = local_15c0._24_4_ * auVar80._24_4_;
            auVar24._28_4_ = auVar80._28_4_;
            auVar80 = vminps_avx(auVar24,local_1600);
            auVar80 = vminps_avx(auVar77,auVar80);
            auVar100 = vcmpps_avx(auVar100,auVar80,2);
            auVar94 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            auVar104 = vpmovzxbw_avx(auVar104);
            auVar94 = vpand_avx(auVar94,auVar104);
            auVar94 = vpshufb_avx(auVar94,_DAT_01fed3c0);
            bVar19 = SUB161(auVar94 >> 7,0) & 1 | (SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar94 >> 0x17,0) & 1) << 2 | (SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar94 >> 0x27,0) & 1) << 4 | (SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar94 >> 0x37,0) & 1) << 6 | SUB161(auVar94 >> 0x3f,0) << 7;
            if (bVar19 != 0) {
              uVar43 = (ulong)bVar19;
              local_17d0 = local_17e8->scene;
              do {
                local_1750 = uVar43;
                lVar44 = 0;
                for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                  lVar44 = lVar44 + 1;
                }
                uVar8 = *(ushort *)(local_1708 + lVar44 * 8);
                uVar9 = *(ushort *)(local_1708 + 2 + lVar44 * 8);
                local_17c8 = (ulong)*(uint *)(local_1708 + 0x88);
                local_1770 = (ulong)*(uint *)(local_1708 + 4 + lVar44 * 8);
                pGVar52 = (local_17d0->geometries).items[local_17c8].ptr;
                local_1740 = *(long *)&pGVar52->field_0x58;
                lVar44 = *(long *)&pGVar52[1].time_range.upper;
                local_1748 = pGVar52[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_1770;
                local_17d8 = uVar8 & 0x7fff;
                local_17dc = uVar9 & 0x7fff;
                uVar46 = *(uint *)(local_1740 + 4 + local_1748);
                uVar53 = (ulong)uVar46;
                uVar43 = (ulong)(uVar46 * local_17dc +
                                *(int *)(local_1740 + local_1748) + local_17d8);
                p_Var10 = pGVar52[1].intersectionFilterN;
                auVar94 = *(undefined1 (*) [16])(lVar44 + (uVar43 + 1) * (long)p_Var10);
                auVar104 = *(undefined1 (*) [16])(lVar44 + (uVar43 + uVar53) * (long)p_Var10);
                lVar48 = uVar43 + uVar53 + 1;
                auVar11 = *(undefined1 (*) [16])(lVar44 + lVar48 * (long)p_Var10);
                auVar105 = *(undefined1 (*) [16])
                            (lVar44 + (uVar43 + (-1 < (short)uVar8) + 1) * (long)p_Var10);
                lVar49 = (ulong)(-1 < (short)uVar8) + lVar48;
                uVar45 = 0;
                if (-1 < (short)uVar9) {
                  uVar45 = uVar53;
                }
                auVar88 = *(undefined1 (*) [16])(lVar44 + lVar49 * (long)p_Var10);
                auVar95 = *(undefined1 (*) [16])
                           (lVar44 + (uVar43 + uVar53 + uVar45) * (long)p_Var10);
                auVar106 = *(undefined1 (*) [16])(lVar44 + (lVar48 + uVar45) * (long)p_Var10);
                auVar122._16_16_ =
                     *(undefined1 (*) [16])(lVar44 + (uVar45 + lVar49) * (long)p_Var10);
                auVar122._0_16_ = auVar11;
                auVar4 = vunpcklps_avx(auVar94,auVar88);
                auVar3 = vunpckhps_avx(auVar94,auVar88);
                auVar5 = vunpcklps_avx(auVar105,auVar11);
                auVar105 = vunpckhps_avx(auVar105,auVar11);
                auVar6 = vunpcklps_avx(auVar3,auVar105);
                auVar7 = vunpcklps_avx(auVar4,auVar5);
                auVar105 = vunpckhps_avx(auVar4,auVar5);
                auVar4 = vunpcklps_avx(auVar104,auVar106);
                auVar3 = vunpckhps_avx(auVar104,auVar106);
                auVar5 = vunpcklps_avx(auVar11,auVar95);
                auVar95 = vunpckhps_avx(auVar11,auVar95);
                auVar3 = vunpcklps_avx(auVar3,auVar95);
                auVar69 = vunpcklps_avx(auVar4,auVar5);
                auVar95 = vunpckhps_avx(auVar4,auVar5);
                auVar84._16_16_ = auVar106;
                auVar84._0_16_ = auVar104;
                auVar73._16_16_ = auVar88;
                auVar73._0_16_ = auVar94;
                auVar100 = vunpcklps_avx(auVar73,auVar84);
                auVar59._16_16_ = auVar11;
                auVar59._0_16_ = *(undefined1 (*) [16])(lVar44 + (long)p_Var10 * uVar43);
                auVar80 = vunpcklps_avx(auVar59,auVar122);
                auVar18 = vunpcklps_avx(auVar80,auVar100);
                auVar100 = vunpckhps_avx(auVar80,auVar100);
                auVar80 = vunpckhps_avx(auVar73,auVar84);
                auVar77 = vunpckhps_avx(auVar59,auVar122);
                auVar80 = vunpcklps_avx(auVar77,auVar80);
                auVar74._16_16_ = auVar7;
                auVar74._0_16_ = auVar7;
                auVar60._16_16_ = auVar105;
                auVar60._0_16_ = auVar105;
                auVar96._16_16_ = auVar6;
                auVar96._0_16_ = auVar6;
                auVar123._16_16_ = auVar69;
                auVar123._0_16_ = auVar69;
                auVar133._16_16_ = auVar95;
                auVar133._0_16_ = auVar95;
                uVar68 = *(undefined4 *)&(local_17f0->org).field_0;
                auVar136._4_4_ = uVar68;
                auVar136._0_4_ = uVar68;
                auVar136._8_4_ = uVar68;
                auVar136._12_4_ = uVar68;
                auVar136._16_4_ = uVar68;
                auVar136._20_4_ = uVar68;
                auVar136._24_4_ = uVar68;
                auVar136._28_4_ = uVar68;
                uVar68 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 4);
                auVar138._4_4_ = uVar68;
                auVar138._0_4_ = uVar68;
                auVar138._8_4_ = uVar68;
                auVar138._12_4_ = uVar68;
                auVar138._16_4_ = uVar68;
                auVar138._20_4_ = uVar68;
                auVar138._24_4_ = uVar68;
                auVar138._28_4_ = uVar68;
                auVar111._16_16_ = auVar3;
                auVar111._0_16_ = auVar3;
                uVar68 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 8);
                auVar150._4_4_ = uVar68;
                auVar150._0_4_ = uVar68;
                auVar150._8_4_ = uVar68;
                auVar150._12_4_ = uVar68;
                auVar150._16_4_ = uVar68;
                auVar150._20_4_ = uVar68;
                auVar150._24_4_ = uVar68;
                auVar150._28_4_ = uVar68;
                local_1680 = vsubps_avx(auVar18,auVar136);
                local_1620 = vsubps_avx(auVar100,auVar138);
                local_1640 = vsubps_avx(auVar80,auVar150);
                auVar100 = vsubps_avx(auVar74,auVar136);
                auVar80 = vsubps_avx(auVar60,auVar138);
                auVar77 = vsubps_avx(auVar96,auVar150);
                auVar18 = vsubps_avx(auVar123,auVar136);
                auVar15 = vsubps_avx(auVar133,auVar138);
                auVar116 = vsubps_avx(auVar111,auVar150);
                local_1380 = vsubps_avx(auVar18,local_1680);
                local_1660 = vsubps_avx(auVar15,local_1620);
                local_13a0 = vsubps_avx(auVar116,local_1640);
                auVar75._0_4_ = auVar18._0_4_ + local_1680._0_4_;
                auVar75._4_4_ = auVar18._4_4_ + local_1680._4_4_;
                auVar75._8_4_ = auVar18._8_4_ + local_1680._8_4_;
                auVar75._12_4_ = auVar18._12_4_ + local_1680._12_4_;
                auVar75._16_4_ = auVar18._16_4_ + local_1680._16_4_;
                auVar75._20_4_ = auVar18._20_4_ + local_1680._20_4_;
                auVar75._24_4_ = auVar18._24_4_ + local_1680._24_4_;
                auVar75._28_4_ = auVar18._28_4_ + local_1680._28_4_;
                auVar61._0_4_ = local_1620._0_4_ + auVar15._0_4_;
                auVar61._4_4_ = local_1620._4_4_ + auVar15._4_4_;
                auVar61._8_4_ = local_1620._8_4_ + auVar15._8_4_;
                auVar61._12_4_ = local_1620._12_4_ + auVar15._12_4_;
                auVar61._16_4_ = local_1620._16_4_ + auVar15._16_4_;
                auVar61._20_4_ = local_1620._20_4_ + auVar15._20_4_;
                auVar61._24_4_ = local_1620._24_4_ + auVar15._24_4_;
                auVar61._28_4_ = local_1620._28_4_ + auVar15._28_4_;
                fVar139 = local_1640._0_4_;
                auVar112._0_4_ = auVar116._0_4_ + fVar139;
                fVar140 = local_1640._4_4_;
                auVar112._4_4_ = auVar116._4_4_ + fVar140;
                fVar141 = local_1640._8_4_;
                auVar112._8_4_ = auVar116._8_4_ + fVar141;
                fVar142 = local_1640._12_4_;
                auVar112._12_4_ = auVar116._12_4_ + fVar142;
                fVar143 = local_1640._16_4_;
                auVar112._16_4_ = auVar116._16_4_ + fVar143;
                fVar144 = local_1640._20_4_;
                auVar112._20_4_ = auVar116._20_4_ + fVar144;
                auVar95._0_4_ = local_1640._24_4_;
                auVar112._24_4_ = auVar116._24_4_ + auVar95._0_4_;
                auVar112._28_4_ = auVar116._28_4_ + local_1640._28_4_;
                auVar25._4_4_ = local_13a0._4_4_ * auVar61._4_4_;
                auVar25._0_4_ = local_13a0._0_4_ * auVar61._0_4_;
                auVar25._8_4_ = local_13a0._8_4_ * auVar61._8_4_;
                auVar25._12_4_ = local_13a0._12_4_ * auVar61._12_4_;
                auVar25._16_4_ = local_13a0._16_4_ * auVar61._16_4_;
                auVar25._20_4_ = local_13a0._20_4_ * auVar61._20_4_;
                auVar25._24_4_ = local_13a0._24_4_ * auVar61._24_4_;
                auVar25._28_4_ = uVar68;
                auVar104 = vfmsub231ps_fma(auVar25,local_1660,auVar112);
                auVar26._4_4_ = local_1380._4_4_ * auVar112._4_4_;
                auVar26._0_4_ = local_1380._0_4_ * auVar112._0_4_;
                auVar26._8_4_ = local_1380._8_4_ * auVar112._8_4_;
                auVar26._12_4_ = local_1380._12_4_ * auVar112._12_4_;
                auVar26._16_4_ = local_1380._16_4_ * auVar112._16_4_;
                auVar26._20_4_ = local_1380._20_4_ * auVar112._20_4_;
                auVar26._24_4_ = local_1380._24_4_ * auVar112._24_4_;
                auVar26._28_4_ = auVar112._28_4_;
                auVar94 = vfmsub231ps_fma(auVar26,local_13a0,auVar75);
                auVar27._4_4_ = local_1660._4_4_ * auVar75._4_4_;
                auVar27._0_4_ = local_1660._0_4_ * auVar75._0_4_;
                auVar27._8_4_ = local_1660._8_4_ * auVar75._8_4_;
                auVar27._12_4_ = local_1660._12_4_ * auVar75._12_4_;
                auVar27._16_4_ = local_1660._16_4_ * auVar75._16_4_;
                auVar27._20_4_ = local_1660._20_4_ * auVar75._20_4_;
                auVar27._24_4_ = local_1660._24_4_ * auVar75._24_4_;
                auVar27._28_4_ = auVar75._28_4_;
                auVar11 = vfmsub231ps_fma(auVar27,local_1380,auVar61);
                uVar68 = *(undefined4 *)((long)&(local_17f0->dir).field_0 + 4);
                local_17c0._4_4_ = uVar68;
                local_17c0._0_4_ = uVar68;
                local_17c0._8_4_ = uVar68;
                local_17c0._12_4_ = uVar68;
                local_17c0._16_4_ = uVar68;
                local_17c0._20_4_ = uVar68;
                local_17c0._24_4_ = uVar68;
                local_17c0._28_4_ = uVar68;
                local_1700._4_4_ = (local_17f0->dir).field_0.m128[2];
                auVar76._0_4_ = local_1700._4_4_ * auVar11._0_4_;
                auVar76._4_4_ = local_1700._4_4_ * auVar11._4_4_;
                auVar76._8_4_ = local_1700._4_4_ * auVar11._8_4_;
                auVar76._12_4_ = local_1700._4_4_ * auVar11._12_4_;
                auVar76._16_4_ = local_1700._4_4_ * 0.0;
                auVar76._20_4_ = local_1700._4_4_ * 0.0;
                auVar76._24_4_ = local_1700._4_4_ * 0.0;
                auVar76._28_4_ = 0;
                auVar94 = vfmadd231ps_fma(auVar76,local_17c0,ZEXT1632(auVar94));
                uVar68 = *(undefined4 *)&(local_17f0->dir).field_0;
                local_17a0._4_4_ = uVar68;
                local_17a0._0_4_ = uVar68;
                local_17a0._8_4_ = uVar68;
                local_17a0._12_4_ = uVar68;
                local_17a0._16_4_ = uVar68;
                local_17a0._20_4_ = uVar68;
                local_17a0._24_4_ = uVar68;
                local_17a0._28_4_ = uVar68;
                auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_17a0,ZEXT1632(auVar104));
                local_13c0 = vsubps_avx(local_1620,auVar80);
                local_13e0 = vsubps_avx(local_1640,auVar77);
                auVar152._0_4_ = local_1620._0_4_ + auVar80._0_4_;
                auVar152._4_4_ = local_1620._4_4_ + auVar80._4_4_;
                auVar152._8_4_ = local_1620._8_4_ + auVar80._8_4_;
                auVar152._12_4_ = local_1620._12_4_ + auVar80._12_4_;
                auVar152._16_4_ = local_1620._16_4_ + auVar80._16_4_;
                auVar152._20_4_ = local_1620._20_4_ + auVar80._20_4_;
                auVar152._24_4_ = local_1620._24_4_ + auVar80._24_4_;
                auVar152._28_4_ = local_1620._28_4_ + auVar80._28_4_;
                auVar113._0_4_ = auVar77._0_4_ + fVar139;
                auVar113._4_4_ = auVar77._4_4_ + fVar140;
                auVar113._8_4_ = auVar77._8_4_ + fVar141;
                auVar113._12_4_ = auVar77._12_4_ + fVar142;
                auVar113._16_4_ = auVar77._16_4_ + fVar143;
                auVar113._20_4_ = auVar77._20_4_ + fVar144;
                auVar113._24_4_ = auVar77._24_4_ + auVar95._0_4_;
                auVar113._28_4_ = auVar77._28_4_ + local_1640._28_4_;
                fVar58 = local_13e0._0_4_;
                fVar64 = local_13e0._4_4_;
                auVar28._4_4_ = auVar152._4_4_ * fVar64;
                auVar28._0_4_ = auVar152._0_4_ * fVar58;
                fVar66 = local_13e0._8_4_;
                auVar28._8_4_ = auVar152._8_4_ * fVar66;
                auVar88._0_4_ = local_13e0._12_4_;
                auVar28._12_4_ = auVar152._12_4_ * auVar88._0_4_;
                fVar91 = local_13e0._16_4_;
                auVar28._16_4_ = auVar152._16_4_ * fVar91;
                fVar93 = local_13e0._20_4_;
                auVar28._20_4_ = auVar152._20_4_ * fVar93;
                fVar13 = local_13e0._24_4_;
                auVar28._24_4_ = auVar152._24_4_ * fVar13;
                auVar28._28_4_ = local_1380._28_4_;
                auVar11 = vfmsub231ps_fma(auVar28,local_13c0,auVar113);
                auVar16 = vsubps_avx(local_1680,auVar100);
                fVar63 = auVar16._0_4_;
                fVar65 = auVar16._4_4_;
                auVar29._4_4_ = auVar113._4_4_ * fVar65;
                auVar29._0_4_ = auVar113._0_4_ * fVar63;
                fVar67 = auVar16._8_4_;
                auVar29._8_4_ = auVar113._8_4_ * fVar67;
                fVar86 = auVar16._12_4_;
                auVar29._12_4_ = auVar113._12_4_ * fVar86;
                fVar92 = auVar16._16_4_;
                auVar29._16_4_ = auVar113._16_4_ * fVar92;
                fVar12 = auVar16._20_4_;
                auVar29._20_4_ = auVar113._20_4_ * fVar12;
                fVar14 = auVar16._24_4_;
                auVar29._24_4_ = auVar113._24_4_ * fVar14;
                auVar29._28_4_ = local_13a0._28_4_;
                auVar114._0_4_ = local_1680._0_4_ + auVar100._0_4_;
                auVar114._4_4_ = local_1680._4_4_ + auVar100._4_4_;
                auVar114._8_4_ = local_1680._8_4_ + auVar100._8_4_;
                auVar114._12_4_ = local_1680._12_4_ + auVar100._12_4_;
                auVar114._16_4_ = local_1680._16_4_ + auVar100._16_4_;
                auVar114._20_4_ = local_1680._20_4_ + auVar100._20_4_;
                auVar114._24_4_ = local_1680._24_4_ + auVar100._24_4_;
                auVar114._28_4_ = local_1680._28_4_ + auVar100._28_4_;
                auVar104 = vfmsub231ps_fma(auVar29,local_13e0,auVar114);
                fVar153 = local_13c0._0_4_;
                fVar155 = local_13c0._4_4_;
                auVar30._4_4_ = fVar155 * auVar114._4_4_;
                auVar30._0_4_ = fVar153 * auVar114._0_4_;
                fVar156 = local_13c0._8_4_;
                auVar30._8_4_ = fVar156 * auVar114._8_4_;
                fVar157 = local_13c0._12_4_;
                auVar30._12_4_ = fVar157 * auVar114._12_4_;
                fVar158 = local_13c0._16_4_;
                auVar30._16_4_ = fVar158 * auVar114._16_4_;
                fVar159 = local_13c0._20_4_;
                auVar30._20_4_ = fVar159 * auVar114._20_4_;
                fVar160 = local_13c0._24_4_;
                auVar30._24_4_ = fVar160 * auVar114._24_4_;
                auVar30._28_4_ = auVar114._28_4_;
                auVar105 = vfmsub231ps_fma(auVar30,auVar16,auVar152);
                auVar115._0_4_ = local_1700._4_4_ * auVar105._0_4_;
                auVar115._4_4_ = local_1700._4_4_ * auVar105._4_4_;
                auVar115._8_4_ = local_1700._4_4_ * auVar105._8_4_;
                auVar115._12_4_ = local_1700._4_4_ * auVar105._12_4_;
                auVar115._16_4_ = local_1700._4_4_ * 0.0;
                auVar115._20_4_ = local_1700._4_4_ * 0.0;
                auVar115._24_4_ = local_1700._4_4_ * 0.0;
                auVar115._28_4_ = 0;
                auVar104 = vfmadd231ps_fma(auVar115,local_17c0,ZEXT1632(auVar104));
                auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_17a0,ZEXT1632(auVar11));
                auVar17 = vsubps_avx(auVar100,auVar18);
                auVar118._0_4_ = auVar100._0_4_ + auVar18._0_4_;
                auVar118._4_4_ = auVar100._4_4_ + auVar18._4_4_;
                auVar118._8_4_ = auVar100._8_4_ + auVar18._8_4_;
                auVar118._12_4_ = auVar100._12_4_ + auVar18._12_4_;
                auVar118._16_4_ = auVar100._16_4_ + auVar18._16_4_;
                auVar118._20_4_ = auVar100._20_4_ + auVar18._20_4_;
                auVar118._24_4_ = auVar100._24_4_ + auVar18._24_4_;
                auVar118._28_4_ = auVar100._28_4_ + auVar18._28_4_;
                auVar18 = vsubps_avx(auVar80,auVar15);
                auVar97._0_4_ = auVar80._0_4_ + auVar15._0_4_;
                auVar97._4_4_ = auVar80._4_4_ + auVar15._4_4_;
                auVar97._8_4_ = auVar80._8_4_ + auVar15._8_4_;
                auVar97._12_4_ = auVar80._12_4_ + auVar15._12_4_;
                auVar97._16_4_ = auVar80._16_4_ + auVar15._16_4_;
                auVar97._20_4_ = auVar80._20_4_ + auVar15._20_4_;
                auVar97._24_4_ = auVar80._24_4_ + auVar15._24_4_;
                auVar97._28_4_ = auVar80._28_4_ + auVar15._28_4_;
                auVar15 = vsubps_avx(auVar77,auVar116);
                auVar89._0_4_ = auVar77._0_4_ + auVar116._0_4_;
                auVar89._4_4_ = auVar77._4_4_ + auVar116._4_4_;
                auVar89._8_4_ = auVar77._8_4_ + auVar116._8_4_;
                auVar89._12_4_ = auVar77._12_4_ + auVar116._12_4_;
                auVar89._16_4_ = auVar77._16_4_ + auVar116._16_4_;
                auVar89._20_4_ = auVar77._20_4_ + auVar116._20_4_;
                auVar89._24_4_ = auVar77._24_4_ + auVar116._24_4_;
                auVar89._28_4_ = auVar77._28_4_ + auVar116._28_4_;
                auVar124._0_4_ = auVar97._0_4_ * auVar15._0_4_;
                auVar124._4_4_ = auVar97._4_4_ * auVar15._4_4_;
                auVar124._8_4_ = auVar97._8_4_ * auVar15._8_4_;
                auVar124._12_4_ = auVar97._12_4_ * auVar15._12_4_;
                auVar124._16_4_ = auVar97._16_4_ * auVar15._16_4_;
                auVar124._20_4_ = auVar97._20_4_ * auVar15._20_4_;
                auVar124._24_4_ = auVar97._24_4_ * auVar15._24_4_;
                auVar124._28_4_ = 0;
                auVar105 = vfmsub231ps_fma(auVar124,auVar18,auVar89);
                auVar31._4_4_ = auVar89._4_4_ * auVar17._4_4_;
                auVar31._0_4_ = auVar89._0_4_ * auVar17._0_4_;
                auVar31._8_4_ = auVar89._8_4_ * auVar17._8_4_;
                auVar31._12_4_ = auVar89._12_4_ * auVar17._12_4_;
                auVar31._16_4_ = auVar89._16_4_ * auVar17._16_4_;
                auVar31._20_4_ = auVar89._20_4_ * auVar17._20_4_;
                auVar31._24_4_ = auVar89._24_4_ * auVar17._24_4_;
                auVar31._28_4_ = auVar89._28_4_;
                auVar11 = vfmsub231ps_fma(auVar31,auVar15,auVar118);
                auVar32._4_4_ = auVar118._4_4_ * auVar18._4_4_;
                auVar32._0_4_ = auVar118._0_4_ * auVar18._0_4_;
                auVar32._8_4_ = auVar118._8_4_ * auVar18._8_4_;
                auVar32._12_4_ = auVar118._12_4_ * auVar18._12_4_;
                auVar32._16_4_ = auVar118._16_4_ * auVar18._16_4_;
                auVar32._20_4_ = auVar118._20_4_ * auVar18._20_4_;
                auVar32._24_4_ = auVar118._24_4_ * auVar18._24_4_;
                auVar32._28_4_ = auVar118._28_4_;
                auVar106 = vfmsub231ps_fma(auVar32,auVar17,auVar97);
                local_1700._0_4_ = local_1700._4_4_;
                fStack_16f8 = local_1700._4_4_;
                fStack_16f4 = local_1700._4_4_;
                fStack_16f0 = local_1700._4_4_;
                fStack_16ec = local_1700._4_4_;
                fStack_16e8 = local_1700._4_4_;
                fStack_16e4 = local_1700._4_4_;
                auVar33._4_4_ = local_1700._4_4_ * auVar106._4_4_;
                auVar33._0_4_ = local_1700._4_4_ * auVar106._0_4_;
                auVar33._8_4_ = local_1700._4_4_ * auVar106._8_4_;
                auVar33._12_4_ = local_1700._4_4_ * auVar106._12_4_;
                auVar33._16_4_ = local_1700._4_4_ * 0.0;
                auVar33._20_4_ = local_1700._4_4_ * 0.0;
                auVar33._24_4_ = local_1700._4_4_ * 0.0;
                auVar33._28_4_ = auVar97._28_4_;
                auVar11 = vfmadd231ps_fma(auVar33,local_17c0,ZEXT1632(auVar11));
                auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_17a0,ZEXT1632(auVar105));
                fVar145 = auVar11._0_4_ + auVar94._0_4_ + auVar104._0_4_;
                fVar147 = auVar11._4_4_ + auVar94._4_4_ + auVar104._4_4_;
                fVar148 = auVar11._8_4_ + auVar94._8_4_ + auVar104._8_4_;
                fVar149 = auVar11._12_4_ + auVar94._12_4_ + auVar104._12_4_;
                local_1320 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar148,CONCAT44(fVar147,fVar145)))
                                     );
                auVar90._8_4_ = 0x7fffffff;
                auVar90._0_8_ = 0x7fffffff7fffffff;
                auVar90._12_4_ = 0x7fffffff;
                auVar90._16_4_ = 0x7fffffff;
                auVar90._20_4_ = 0x7fffffff;
                auVar90._24_4_ = 0x7fffffff;
                auVar90._28_4_ = 0x7fffffff;
                auVar77 = ZEXT1632(auVar94);
                auVar100 = vminps_avx(auVar77,ZEXT1632(auVar104));
                auVar100 = vminps_avx(auVar100,ZEXT1632(auVar11));
                local_1580 = vandps_avx(local_1320,auVar90);
                fVar121 = local_1580._0_4_ * 1.1920929e-07;
                fVar127 = local_1580._4_4_ * 1.1920929e-07;
                auVar34._4_4_ = fVar127;
                auVar34._0_4_ = fVar121;
                fVar128 = local_1580._8_4_ * 1.1920929e-07;
                auVar34._8_4_ = fVar128;
                fVar129 = local_1580._12_4_ * 1.1920929e-07;
                auVar34._12_4_ = fVar129;
                fVar130 = local_1580._16_4_ * 1.1920929e-07;
                auVar34._16_4_ = fVar130;
                fVar131 = local_1580._20_4_ * 1.1920929e-07;
                auVar34._20_4_ = fVar131;
                fVar132 = local_1580._24_4_ * 1.1920929e-07;
                auVar34._24_4_ = fVar132;
                auVar34._28_4_ = 0x34000000;
                auVar134._0_8_ = CONCAT44(fVar127,fVar121) ^ 0x8000000080000000;
                auVar134._8_4_ = -fVar128;
                auVar134._12_4_ = -fVar129;
                auVar134._16_4_ = -fVar130;
                auVar134._20_4_ = -fVar131;
                auVar134._24_4_ = -fVar132;
                auVar134._28_4_ = 0xb4000000;
                auVar100 = vcmpps_avx(auVar100,auVar134,5);
                auVar116 = ZEXT1632(auVar104);
                auVar80 = vmaxps_avx(auVar77,auVar116);
                auVar80 = vmaxps_avx(auVar80,ZEXT1632(auVar11));
                auVar80 = vcmpps_avx(auVar80,auVar34,2);
                local_1400 = vorps_avx(auVar100,auVar80);
                auVar80 = local_15a0 & local_1400;
                if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar80 >> 0x7f,0) != '\0') ||
                      (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar80 >> 0xbf,0) != '\0') ||
                    (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar80[0x1f] < '\0') {
                  local_1420 = 0x80000000;
                  uStack_141c = 0x80000000;
                  uStack_1418 = 0x80000000;
                  uStack_1414 = 0x80000000;
                  uStack_1410 = 0x80000000;
                  uStack_140c = 0x80000000;
                  uStack_1408 = 0x80000000;
                  uStack_1404 = 0x80000000;
                  auVar35._4_4_ = local_13a0._4_4_ * fVar155;
                  auVar35._0_4_ = local_13a0._0_4_ * fVar153;
                  auVar35._8_4_ = local_13a0._8_4_ * fVar156;
                  auVar35._12_4_ = local_13a0._12_4_ * fVar157;
                  auVar35._16_4_ = local_13a0._16_4_ * fVar158;
                  auVar35._20_4_ = local_13a0._20_4_ * fVar159;
                  auVar35._24_4_ = local_13a0._24_4_ * fVar160;
                  auVar35._28_4_ = local_1400._28_4_;
                  auVar36._4_4_ = local_1660._4_4_ * fVar65;
                  auVar36._0_4_ = local_1660._0_4_ * fVar63;
                  auVar36._8_4_ = local_1660._8_4_ * fVar67;
                  auVar36._12_4_ = local_1660._12_4_ * fVar86;
                  auVar36._16_4_ = local_1660._16_4_ * fVar92;
                  auVar36._20_4_ = local_1660._20_4_ * fVar12;
                  auVar36._24_4_ = local_1660._24_4_ * fVar14;
                  auVar36._28_4_ = auVar100._28_4_;
                  auVar94 = vfmsub213ps_fma(local_1660,local_13e0,auVar35);
                  auVar37._4_4_ = fVar64 * auVar18._4_4_;
                  auVar37._0_4_ = fVar58 * auVar18._0_4_;
                  auVar37._8_4_ = fVar66 * auVar18._8_4_;
                  auVar37._12_4_ = auVar88._0_4_ * auVar18._12_4_;
                  auVar37._16_4_ = fVar91 * auVar18._16_4_;
                  auVar37._20_4_ = fVar93 * auVar18._20_4_;
                  auVar37._24_4_ = fVar13 * auVar18._24_4_;
                  auVar37._28_4_ = 0x34000000;
                  local_1660 = local_1320;
                  auVar38._4_4_ = fVar65 * auVar15._4_4_;
                  auVar38._0_4_ = fVar63 * auVar15._0_4_;
                  auVar38._8_4_ = fVar67 * auVar15._8_4_;
                  auVar38._12_4_ = fVar86 * auVar15._12_4_;
                  auVar38._16_4_ = fVar92 * auVar15._16_4_;
                  auVar38._20_4_ = fVar12 * auVar15._20_4_;
                  auVar38._24_4_ = fVar14 * auVar15._24_4_;
                  auVar38._28_4_ = 0;
                  auVar104 = vfmsub213ps_fma(auVar15,local_13c0,auVar37);
                  auVar100 = vandps_avx(auVar35,auVar90);
                  auVar80 = vandps_avx(auVar37,auVar90);
                  auVar100 = vcmpps_avx(auVar100,auVar80,1);
                  auVar15 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar94),auVar100);
                  auVar39._4_4_ = fVar155 * auVar17._4_4_;
                  auVar39._0_4_ = fVar153 * auVar17._0_4_;
                  auVar39._8_4_ = fVar156 * auVar17._8_4_;
                  auVar39._12_4_ = fVar157 * auVar17._12_4_;
                  auVar39._16_4_ = fVar158 * auVar17._16_4_;
                  auVar39._20_4_ = fVar159 * auVar17._20_4_;
                  auVar39._24_4_ = fVar160 * auVar17._24_4_;
                  auVar39._28_4_ = auVar100._28_4_;
                  auVar94 = vfmsub213ps_fma(auVar17,local_13e0,auVar38);
                  auVar108._0_4_ = local_1380._0_4_ * fVar58;
                  auVar108._4_4_ = local_1380._4_4_ * fVar64;
                  auVar108._8_4_ = local_1380._8_4_ * fVar66;
                  auVar108._12_4_ = local_1380._12_4_ * auVar88._0_4_;
                  auVar108._16_4_ = local_1380._16_4_ * fVar91;
                  auVar108._20_4_ = local_1380._20_4_ * fVar93;
                  auVar108._24_4_ = local_1380._24_4_ * fVar13;
                  auVar108._28_4_ = 0;
                  auVar104 = vfmsub213ps_fma(local_13a0,auVar16,auVar108);
                  auVar100 = vandps_avx(auVar108,auVar90);
                  auVar80 = vandps_avx(auVar38,auVar90);
                  auVar100 = vcmpps_avx(auVar100,auVar80,1);
                  auVar17 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar104),auVar100);
                  auVar94 = vfmsub213ps_fma(local_1380,local_13c0,auVar36);
                  auVar104 = vfmsub213ps_fma(auVar18,auVar16,auVar39);
                  auVar100 = vandps_avx(auVar36,auVar90);
                  auVar80 = vandps_avx(auVar39,auVar90);
                  auVar100 = vcmpps_avx(auVar100,auVar80,1);
                  auVar18 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar94),auVar100);
                  fVar58 = auVar18._0_4_;
                  fVar63 = auVar18._4_4_;
                  auVar40._4_4_ = fVar63 * local_1700._4_4_;
                  auVar40._0_4_ = fVar58 * local_1700._4_4_;
                  fVar64 = auVar18._8_4_;
                  auVar40._8_4_ = fVar64 * local_1700._4_4_;
                  fVar65 = auVar18._12_4_;
                  auVar40._12_4_ = fVar65 * local_1700._4_4_;
                  fVar66 = auVar18._16_4_;
                  auVar40._16_4_ = fVar66 * local_1700._4_4_;
                  fVar67 = auVar18._20_4_;
                  auVar40._20_4_ = fVar67 * local_1700._4_4_;
                  auVar88._0_4_ = auVar18._24_4_;
                  auVar40._24_4_ = auVar88._0_4_ * local_1700._4_4_;
                  auVar40._28_4_ = auVar100._28_4_;
                  auVar94 = vfmadd213ps_fma(local_17c0,auVar17,auVar40);
                  auVar94 = vfmadd213ps_fma(local_17a0,auVar15,ZEXT1632(auVar94));
                  fVar86 = auVar94._0_4_ + auVar94._0_4_;
                  fVar91 = auVar94._4_4_ + auVar94._4_4_;
                  fVar92 = auVar94._8_4_ + auVar94._8_4_;
                  fVar93 = auVar94._12_4_ + auVar94._12_4_;
                  auVar101 = ZEXT1632(CONCAT412(fVar93,CONCAT48(fVar92,CONCAT44(fVar91,fVar86))));
                  auVar98._0_4_ = fVar58 * fVar139;
                  auVar98._4_4_ = fVar63 * fVar140;
                  auVar98._8_4_ = fVar64 * fVar141;
                  auVar98._12_4_ = fVar65 * fVar142;
                  auVar98._16_4_ = fVar66 * fVar143;
                  auVar98._20_4_ = fVar67 * fVar144;
                  auVar98._24_4_ = auVar88._0_4_ * auVar95._0_4_;
                  auVar98._28_4_ = 0;
                  auVar94 = vfmadd213ps_fma(local_1620,auVar17,auVar98);
                  auVar100 = vrcpps_avx(auVar101);
                  auVar104 = vfmadd213ps_fma(local_1680,auVar15,ZEXT1632(auVar94));
                  auVar125._8_4_ = 0x3f800000;
                  auVar125._0_8_ = 0x3f8000003f800000;
                  auVar125._12_4_ = 0x3f800000;
                  auVar125._16_4_ = 0x3f800000;
                  auVar125._20_4_ = 0x3f800000;
                  auVar125._24_4_ = 0x3f800000;
                  auVar125._28_4_ = 0x3f800000;
                  auVar94 = vfnmadd213ps_fma(auVar100,auVar101,auVar125);
                  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar100,auVar100);
                  local_1280 = ZEXT1632(CONCAT412((auVar104._12_4_ + auVar104._12_4_) *
                                                  auVar94._12_4_,
                                                  CONCAT48((auVar104._8_4_ + auVar104._8_4_) *
                                                           auVar94._8_4_,
                                                           CONCAT44((auVar104._4_4_ + auVar104._4_4_
                                                                    ) * auVar94._4_4_,
                                                                    (auVar104._0_4_ + auVar104._0_4_
                                                                    ) * auVar94._0_4_))));
                  uVar68 = *(undefined4 *)((long)&(local_17f0->org).field_0 + 0xc);
                  auVar99._4_4_ = uVar68;
                  auVar99._0_4_ = uVar68;
                  auVar99._8_4_ = uVar68;
                  auVar99._12_4_ = uVar68;
                  auVar99._16_4_ = uVar68;
                  auVar99._20_4_ = uVar68;
                  auVar99._24_4_ = uVar68;
                  auVar99._28_4_ = uVar68;
                  auVar100 = vcmpps_avx(auVar99,local_1280,2);
                  fVar139 = local_17f0->tfar;
                  auVar119._4_4_ = fVar139;
                  auVar119._0_4_ = fVar139;
                  auVar119._8_4_ = fVar139;
                  auVar119._12_4_ = fVar139;
                  auVar119._16_4_ = fVar139;
                  auVar119._20_4_ = fVar139;
                  auVar119._24_4_ = fVar139;
                  auVar119._28_4_ = fVar139;
                  auVar80 = vcmpps_avx(local_1280,auVar119,2);
                  auVar100 = vandps_avx(auVar80,auVar100);
                  auVar120._0_8_ = CONCAT44(fVar91,fVar86) ^ 0x8000000080000000;
                  auVar120._8_4_ = -fVar92;
                  auVar120._12_4_ = -fVar93;
                  auVar120._16_4_ = 0x80000000;
                  auVar120._20_4_ = 0x80000000;
                  auVar120._24_4_ = 0x80000000;
                  auVar120._28_4_ = 0x80000000;
                  auVar80 = vcmpps_avx(auVar101,auVar120,4);
                  auVar100 = vandps_avx(auVar80,auVar100);
                  auVar80 = vandps_avx(local_1400,local_15a0);
                  auVar100 = vpslld_avx2(auVar100,0x1f);
                  auVar101 = vpsrad_avx2(auVar100,0x1f);
                  auVar100 = auVar80 & auVar101;
                  if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar100 >> 0x7f,0) != '\0') ||
                        (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0xbf,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar100[0x1f] < '\0') {
                    auVar2._0_4_ = local_17f0->tfar;
                    auVar2._4_4_ = local_17f0->mask;
                    auVar2._8_4_ = local_17f0->id;
                    auVar2._12_4_ = local_17f0->flags;
                    local_12e0 = vandps_avx(auVar101,auVar80);
                    uVar46 = vextractps_avx(auVar2,1);
                    local_1300 = &local_17f1;
                    auVar100 = vsubps_avx(local_1320,auVar116);
                    local_1360 = vblendvps_avx(auVar77,auVar100,local_1440);
                    auVar100 = vsubps_avx(local_1320,auVar77);
                    local_1340 = vblendvps_avx(auVar116,auVar100,local_1440);
                    local_1260._4_4_ = auVar15._4_4_ * (float)local_1460._4_4_;
                    local_1260._0_4_ = auVar15._0_4_ * (float)local_1460._0_4_;
                    local_1260._8_4_ = auVar15._8_4_ * fStack_1458;
                    local_1260._12_4_ = auVar15._12_4_ * fStack_1454;
                    local_1260._16_4_ = auVar15._16_4_ * fStack_1450;
                    local_1260._20_4_ = auVar15._20_4_ * fStack_144c;
                    local_1260._24_4_ = auVar15._24_4_ * fStack_1448;
                    local_1260._28_4_ = 0;
                    local_1240._4_4_ = (float)local_1460._4_4_ * auVar17._4_4_;
                    local_1240._0_4_ = (float)local_1460._0_4_ * auVar17._0_4_;
                    local_1240._8_4_ = fStack_1458 * auVar17._8_4_;
                    local_1240._12_4_ = fStack_1454 * auVar17._12_4_;
                    local_1240._16_4_ = fStack_1450 * auVar17._16_4_;
                    local_1240._20_4_ = fStack_144c * auVar17._20_4_;
                    local_1240._24_4_ = fStack_1448 * auVar17._24_4_;
                    local_1240._28_4_ = auVar17._28_4_;
                    local_1220[0] = (float)local_1460._0_4_ * fVar58;
                    local_1220[1] = (float)local_1460._4_4_ * fVar63;
                    local_1220[2] = fStack_1458 * fVar64;
                    local_1220[3] = fStack_1454 * fVar65;
                    fStack_1210 = fStack_1450 * fVar66;
                    fStack_120c = fStack_144c * fVar67;
                    fStack_1208 = fStack_1448 * auVar88._0_4_;
                    uStack_1204 = auVar18._28_4_;
                    pGVar52 = (local_17d0->geometries).items[local_17c8].ptr;
                    if ((pGVar52->mask & uVar46) != 0) {
                      pRVar50 = local_17e8->args;
                      if ((pRVar50->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar52->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_004d9259:
                        local_17f0->tfar = -INFINITY;
                        return;
                      }
                      auVar62._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar62._8_4_ = local_17d8;
                      auVar62._12_4_ = local_17d8;
                      auVar62._16_4_ = local_17d8;
                      auVar62._20_4_ = local_17d8;
                      auVar62._24_4_ = local_17d8;
                      auVar62._28_4_ = local_17d8;
                      auVar100 = vpaddd_avx2(auVar62,_DAT_01fec4a0);
                      auVar78._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                      auVar78._8_4_ = local_17dc;
                      auVar78._12_4_ = local_17dc;
                      auVar78._16_4_ = local_17dc;
                      auVar78._20_4_ = local_17dc;
                      auVar78._24_4_ = local_17dc;
                      auVar78._28_4_ = local_17dc;
                      auVar107._0_4_ = (float)(int)(*(ushort *)(local_1740 + 8 + local_1748) - 1);
                      auVar107._4_12_ = auVar16._4_12_;
                      auVar77 = vpaddd_avx2(auVar78,_DAT_01fec4c0);
                      auVar94 = vrcpss_avx(auVar107,auVar107);
                      auVar104 = vfnmadd213ss_fma(auVar107,auVar94,SUB6416(ZEXT464(0x40000000),0));
                      fVar139 = auVar94._0_4_ * auVar104._0_4_;
                      auVar110._0_4_ = (float)(int)(*(ushort *)(local_1740 + 10 + local_1748) - 1);
                      auVar110._4_12_ = auVar16._4_12_;
                      auVar94 = vrcpss_avx(auVar110,auVar110);
                      auVar104 = vfnmadd213ss_fma(auVar110,auVar94,SUB6416(ZEXT464(0x40000000),0));
                      fVar140 = auVar94._0_4_ * auVar104._0_4_;
                      auVar80 = vcvtdq2ps_avx(auVar100);
                      auVar77 = vcvtdq2ps_avx(auVar77);
                      auVar100 = vrcpps_avx(local_1320);
                      auVar102._8_4_ = 0x3f800000;
                      auVar102._0_8_ = 0x3f8000003f800000;
                      auVar102._12_4_ = 0x3f800000;
                      auVar102._16_4_ = 0x3f800000;
                      auVar102._20_4_ = 0x3f800000;
                      auVar102._24_4_ = 0x3f800000;
                      auVar102._28_4_ = 0x3f800000;
                      auVar94 = vfnmadd213ps_fma(local_1320,auVar100,auVar102);
                      auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar100,auVar100);
                      auVar85._8_4_ = 0x219392ef;
                      auVar85._0_8_ = 0x219392ef219392ef;
                      auVar85._12_4_ = 0x219392ef;
                      auVar85._16_4_ = 0x219392ef;
                      auVar85._20_4_ = 0x219392ef;
                      auVar85._24_4_ = 0x219392ef;
                      auVar85._28_4_ = 0x219392ef;
                      auVar100 = vcmpps_avx(local_1580,auVar85,5);
                      auVar100 = vandps_avx(ZEXT1632(auVar94),auVar100);
                      auVar41._4_4_ =
                           (fVar147 * auVar80._4_4_ + local_1360._4_4_) * fVar139 * auVar100._4_4_;
                      auVar41._0_4_ =
                           (fVar145 * auVar80._0_4_ + local_1360._0_4_) * fVar139 * auVar100._0_4_;
                      auVar41._8_4_ =
                           (fVar148 * auVar80._8_4_ + local_1360._8_4_) * fVar139 * auVar100._8_4_;
                      auVar41._12_4_ =
                           (fVar149 * auVar80._12_4_ + local_1360._12_4_) * fVar139 *
                           auVar100._12_4_;
                      auVar41._16_4_ =
                           (auVar80._16_4_ * 0.0 + local_1360._16_4_) * fVar139 * auVar100._16_4_;
                      auVar41._20_4_ =
                           (auVar80._20_4_ * 0.0 + local_1360._20_4_) * fVar139 * auVar100._20_4_;
                      auVar41._24_4_ =
                           (auVar80._24_4_ * 0.0 + local_1360._24_4_) * fVar139 * auVar100._24_4_;
                      auVar41._28_4_ = auVar80._28_4_ + local_1360._28_4_;
                      local_12c0 = vminps_avx(auVar41,auVar102);
                      auVar42._4_4_ =
                           (fVar147 * auVar77._4_4_ + local_1340._4_4_) * fVar140 * auVar100._4_4_;
                      auVar42._0_4_ =
                           (fVar145 * auVar77._0_4_ + local_1340._0_4_) * fVar140 * auVar100._0_4_;
                      auVar42._8_4_ =
                           (fVar148 * auVar77._8_4_ + local_1340._8_4_) * fVar140 * auVar100._8_4_;
                      auVar42._12_4_ =
                           (fVar149 * auVar77._12_4_ + local_1340._12_4_) * fVar140 *
                           auVar100._12_4_;
                      auVar42._16_4_ =
                           (auVar77._16_4_ * 0.0 + local_1340._16_4_) * fVar140 * auVar100._16_4_;
                      auVar42._20_4_ =
                           (auVar77._20_4_ * 0.0 + local_1340._20_4_) * fVar140 * auVar100._20_4_;
                      auVar42._24_4_ =
                           (auVar77._24_4_ * 0.0 + local_1340._24_4_) * fVar140 * auVar100._24_4_;
                      auVar42._28_4_ = local_12c0._28_4_;
                      local_12a0 = vminps_avx(auVar42,auVar102);
                      uVar46 = vmovmskps_avx(local_12e0);
                      if (uVar46 != 0) {
                        uVar45 = CONCAT44(0,uVar46 & 0xff);
                        local_17a0._0_8_ = uVar45;
                        lVar44 = 0;
                        for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                          lVar44 = lVar44 + 1;
                        }
                        local_1620._0_8_ = local_17e8->user;
                        local_1700 = pRVar50;
                        local_1640._0_16_ = auVar2;
                        local_1680._0_8_ = pGVar52;
                        do {
                          local_16d4 = *(undefined4 *)(local_12c0 + lVar44 * 4);
                          local_16d0 = *(undefined4 *)(local_12a0 + lVar44 * 4);
                          local_17f0->tfar = *(float *)(local_1280 + lVar44 * 4);
                          local_16e0 = *(undefined4 *)(local_1260 + lVar44 * 4);
                          local_16dc = local_1220[lVar44 + -8];
                          local_17c0._0_8_ = lVar44;
                          local_16d8 = local_1220[lVar44];
                          local_16cc = (undefined4)local_1770;
                          local_16c8 = (undefined4)local_17c8;
                          local_16c4 = *(uint *)local_1620._0_8_;
                          local_16c0 = *(uint *)(local_1620._0_8_ + 4);
                          local_17d4 = -1;
                          local_16b0.valid = &local_17d4;
                          local_16b0.geometryUserPtr = pGVar52->userPtr;
                          local_16b0.context = (RTCRayQueryContext *)local_1620._0_8_;
                          local_16b0.ray = (RTCRayN *)local_17f0;
                          local_16b0.hit = (RTCHitN *)&local_16e0;
                          local_16b0.N = 1;
                          if (pGVar52->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_004d910f:
                            if ((pRVar50->filter == (RTCFilterFunctionN)0x0) ||
                               (((pRVar50->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                 RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                ((*(byte *)(local_1680._0_8_ + 0x3e) & 0x40) == 0))))
                            goto LAB_004d9259;
                            (*pRVar50->filter)(&local_16b0);
                            if (*local_16b0.valid != 0) goto LAB_004d9259;
                          }
                          else {
                            (*pGVar52->occlusionFilterN)(&local_16b0);
                            pRVar50 = local_1700;
                            if (*local_16b0.valid != 0) goto LAB_004d910f;
                          }
                          local_17f0->tfar = (float)local_1640._0_4_;
                          uVar53 = local_17a0._0_8_ ^ 1L << (local_17c0._0_8_ & 0x3f);
                          local_17a0._0_8_ = uVar53;
                          lVar44 = 0;
                          for (uVar45 = uVar53; (uVar45 & 1) == 0;
                              uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                            lVar44 = lVar44 + 1;
                          }
                          pRVar50 = local_1700;
                          pGVar52 = (Geometry *)local_1680._0_8_;
                        } while (uVar53 != 0);
                      }
                    }
                  }
                }
                uVar43 = local_1750 - 1 & local_1750;
                auVar126 = ZEXT3264(local_1480);
                auVar135 = ZEXT3264(local_14a0);
                auVar137 = ZEXT3264(local_14c0);
                auVar146 = ZEXT3264(local_1500);
                auVar151 = ZEXT3264(local_1520);
                auVar154 = ZEXT3264(local_1560);
                uVar45 = local_1778;
                uVar53 = local_1780;
                auVar95._0_4_ = local_14e0;
                fVar139 = fStack_14dc;
                fVar140 = fStack_14d8;
                fVar141 = fStack_14d4;
                fVar142 = fStack_14d0;
                fVar143 = fStack_14cc;
                fVar144 = fStack_14c8;
                auVar88._0_4_ = local_1540;
                fVar58 = fStack_153c;
                fVar63 = fStack_1538;
                fVar64 = fStack_1534;
                fVar65 = fStack_1530;
                fVar66 = fStack_152c;
                fVar67 = fStack_1528;
              } while (uVar43 != 0);
            }
            auVar117 = ZEXT3264(local_1600);
            auVar109 = ZEXT3264(local_15e0);
            auVar103 = ZEXT3264(local_15c0);
            local_1768 = local_1768 + 1;
          } while (local_1768 != local_1760);
        }
LAB_004d9241:
      } while (local_1758 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }